

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_sinks.h
# Opt level: O3

filename_t *
spdlog::sinks::rotating_file_sink<spdlog::details::null_mutex>::calc_filename
          (filename_t *__return_storage_ptr__,filename_t *filename,size_t index)

{
  char *pcVar1;
  size_t sVar2;
  filename_t ext;
  filename_t basename;
  type w;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  size_type sStack_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  char *local_2b8;
  size_type sStack_2b0;
  char local_2a8;
  undefined7 uStack_2a7;
  undefined1 local_298 [32];
  _Alloc_hider local_278;
  size_type sStack_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  BasicWriter<char> local_258;
  Buffer<char> local_248;
  char local_228 [504];
  
  local_258.buffer_ = &local_248;
  local_258._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_00126e70;
  local_248.size_ = 0;
  local_248.capacity_ = 500;
  local_248._vptr_Buffer = (_func_int **)&PTR_grow_00126eb8;
  local_248.ptr_ = local_228;
  if (index == 0) {
    local_298._0_8_ = (filename->_M_dataplus)._M_p;
    local_298._8_8_ = filename->_M_string_length;
    fmt::BasicWriter<char>::write(&local_258,0x11c39e,(void *)0xb,(size_t)local_298);
  }
  else {
    sStack_2b0 = 0;
    local_2a8 = '\0';
    sStack_2d0 = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2d8 = &local_2c8;
    local_2b8 = &local_2a8;
    details::file_helper::split_by_extenstion
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_298,filename);
    std::__cxx11::string::operator=((string *)&local_2b8,(string *)&local_278);
    std::__cxx11::string::operator=((string *)&local_2d8,(string *)local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != &local_268) {
      operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    local_298._0_8_ = local_2b8;
    local_298._8_8_ = sStack_2b0;
    local_278._M_p = (pointer)local_2d8;
    sStack_270 = sStack_2d0;
    local_298._16_8_ = index;
    fmt::BasicWriter<char>::write(&local_258,0x11c45b,(void *)0xb5b,(size_t)local_298);
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,CONCAT71(uStack_2a7,local_2a8) + 1);
    }
  }
  pcVar1 = (local_258.buffer_)->ptr_;
  sVar2 = (local_258.buffer_)->size_;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar2);
  local_258._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_00126e70;
  local_248._vptr_Buffer = (_func_int **)&PTR_grow_00126eb8;
  if (local_248.ptr_ != local_228) {
    operator_delete(local_248.ptr_,local_248.capacity_);
  }
  return __return_storage_ptr__;
}

Assistant:

static filename_t calc_filename(const filename_t &filename, std::size_t index)
    {
        typename std::conditional<std::is_same<filename_t::value_type, char>::value, fmt::MemoryWriter, fmt::WMemoryWriter>::type w;
        if (index != 0u)
        {
            filename_t basename, ext;
            std::tie(basename, ext) = details::file_helper::split_by_extenstion(filename);
            w.write(SPDLOG_FILENAME_T("{}.{}{}"), basename, index, ext);
        }
        else
        {
            w.write(SPDLOG_FILENAME_T("{}"), filename);
        }
        return w.str();
    }